

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O3

string * __thiscall
duckdb::EnumType::GetValue_abi_cxx11_(string *__return_storage_ptr__,EnumType *this,Value *val)

{
  pointer pcVar1;
  uint32_t uVar2;
  string *psVar3;
  Vector *this_00;
  optional_ptr<duckdb::ExtraTypeInfo,_true> info;
  optional_ptr<duckdb::ExtraTypeInfo,_true> local_60;
  Value local_58;
  
  local_60.ptr = *(ExtraTypeInfo **)(this + 8);
  optional_ptr<duckdb::ExtraTypeInfo,_true>::CheckValid(&local_60);
  this_00 = (Vector *)(local_60.ptr + 1);
  uVar2 = Value::GetValue<unsigned_int>((Value *)this);
  Vector::GetValue(&local_58,this_00,(ulong)uVar2);
  psVar3 = StringValue::Get_abi_cxx11_(&local_58);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar3->_M_string_length);
  Value::~Value(&local_58);
  return __return_storage_ptr__;
}

Assistant:

const string EnumType::GetValue(const Value &val) {
	auto info = val.type().AuxInfo();
	auto &values_insert_order = info->Cast<EnumTypeInfo>().GetValuesInsertOrder();
	return StringValue::Get(values_insert_order.GetValue(val.GetValue<uint32_t>()));
}